

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::from_user_hex::test_method(from_user_hex *this)

{
  long lVar1;
  undefined1 **ppuVar2;
  char *pcVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator pvVar5;
  iterator in_R9;
  optional<uint256> *poVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view str;
  const_string file_10;
  string_view str_00;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  string_view input_05;
  string_view input_06;
  string_view input_07;
  string_view input_08;
  string_view input_09;
  string_view input_10;
  string_view input_11;
  string_view input_12;
  string_view input_13;
  string_view input_14;
  string_view input_15;
  string_view input_16;
  string_view input_17;
  string_view input_18;
  string_view input_19;
  string_view input_20;
  string *__return_storage_ptr__;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  undefined1 local_a0 [8];
  bool local_98;
  undefined7 uStack_97;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [32];
  bool local_60;
  string valid_hex_64;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128 = "";
  ppuVar2 = &local_140;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x12e;
  file.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar2,msg);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_148 = "";
  poVar6 = (optional<uint256> *)local_80;
  input._M_str = (char *)ppuVar2;
  input._M_len = (size_t)"";
  detail::FromUserHex<uint256>(poVar6,(detail *)0x0,input);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_150,0x12e,1,2,poVar6,"uint256::FromUserHex(\"\")",&uint256::ZERO,
             "uint256::ZERO");
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_158 = "";
  ppuVar2 = &local_170;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)poVar6;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x12f;
  file_00.m_begin = (iterator)&local_160;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar2,msg_00);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_178 = "";
  poVar6 = (optional<uint256> *)local_80;
  input_00._M_str = (char *)ppuVar2;
  input_00._M_len = (size_t)"0x";
  detail::FromUserHex<uint256>(poVar6,(detail *)0x2,input_00);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_180,0x12f,1,2,poVar6,"uint256::FromUserHex(\"0x\")",&uint256::ZERO
             ,"uint256::ZERO");
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_188 = "";
  ppuVar2 = &local_1a0;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)poVar6;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x130;
  file_01.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar2,msg_01);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a8 = "";
  poVar6 = (optional<uint256> *)local_80;
  input_01._M_str = (char *)ppuVar2;
  input_01._M_len = (size_t)"0";
  detail::FromUserHex<uint256>(poVar6,(detail *)&DAT_00000001,input_01);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_1b0,0x130,1,2,poVar6,"uint256::FromUserHex(\"0\")",&uint256::ZERO,
             "uint256::ZERO");
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b8 = "";
  ppuVar2 = &local_1d0;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)poVar6;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_1c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar2,msg_02);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d8 = "";
  poVar6 = (optional<uint256> *)local_80;
  input_02._M_str = (char *)ppuVar2;
  input_02._M_len = (size_t)"00";
  detail::FromUserHex<uint256>(poVar6,(detail *)0x2,input_02);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_1e0,0x131,1,2,poVar6,"uint256::FromUserHex(\"00\")",&uint256::ZERO
             ,"uint256::ZERO");
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e8 = "";
  ppuVar2 = &local_200;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)poVar6;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x132;
  file_03.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)ppuVar2,msg_03);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_208 = "";
  poVar6 = (optional<uint256> *)local_80;
  input_03._M_str = (char *)ppuVar2;
  input_03._M_len = (size_t)"1";
  detail::FromUserHex<uint256>(poVar6,(detail *)&DAT_00000001,input_03);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_210,0x132,1,2,poVar6,"uint256::FromUserHex(\"1\")",&uint256::ONE,
             "uint256::ONE");
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_218 = "";
  ppuVar2 = &local_230;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)poVar6;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x133;
  file_04.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppuVar2,msg_04);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_238 = "";
  input_04._M_str = (char *)ppuVar2;
  input_04._M_len = (size_t)"0x10";
  detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x4,input_04);
  local_90._M_allocated_capacity._1_7_ = 0;
  local_90._8_8_ = 0;
  local_a0._1_7_ = 0;
  local_98 = false;
  uStack_97 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0[0] = (string)0x10;
  pvVar5 = (iterator)0x2;
  pvVar4 = local_80;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_240,0x133,1,2,pvVar4,"uint256::FromUserHex(\"0x10\")",local_a0,
             "uint256{0x10}");
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_248 = "";
  ppuVar2 = &local_260;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x134;
  file_05.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar2,msg_05);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_268 = "";
  input_05._M_str = (char *)ppuVar2;
  input_05._M_len = (size_t)"10";
  detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x2,input_05);
  local_90._M_allocated_capacity._1_7_ = 0;
  local_90._8_8_ = 0;
  local_a0._1_7_ = 0;
  local_98 = false;
  uStack_97 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0[0] = (string)0x10;
  pvVar5 = (iterator)0x2;
  pvVar4 = local_80;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_270,0x134,1,2,pvVar4,"uint256::FromUserHex(\"10\")",local_a0,
             "uint256{0x10}");
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_278 = "";
  ppuVar2 = &local_290;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x135;
  file_06.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar2,msg_06);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_298 = "";
  input_06._M_str = (char *)ppuVar2;
  input_06._M_len = (size_t)"0xFf";
  detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x4,input_06);
  local_90._M_allocated_capacity._1_7_ = 0;
  local_90._8_8_ = 0;
  local_a0._1_7_ = 0;
  local_98 = false;
  uStack_97 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0[0] = (string)0xff;
  pvVar5 = (iterator)0x2;
  pvVar4 = local_80;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_2a0,0x135,1,2,pvVar4,"uint256::FromUserHex(\"0xFf\")",local_a0,
             "uint256{0xff}");
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2a8 = "";
  ppuVar2 = &local_2c0;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x136;
  file_07.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar2,msg_07);
  valid_hex_64._M_string_length._0_1_ = (string)0x0;
  valid_hex_64._M_dataplus._M_p = "<W\x1b";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2c8 = "";
  input_07._M_str = (char *)ppuVar2;
  input_07._M_len = (size_t)"Ff";
  detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x2,input_07);
  local_90._M_allocated_capacity._1_7_ = 0;
  local_90._8_8_ = 0;
  local_a0._1_7_ = 0;
  local_98 = false;
  uStack_97 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0[0] = (string)0xff;
  pvVar5 = (iterator)0x2;
  pvVar4 = local_80;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (&valid_hex_64,&local_2d0,0x136,1,2,pvVar4,"uint256::FromUserHex(\"Ff\")",local_a0,
             "uint256{0xff}");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_hex_64,
             "0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF",
             (allocator<char> *)local_80);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x138;
  file_08.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
             msg_08);
  local_80[8] = '\0';
  local_80._0_8_ = &PTR__lazy_ostream_01139f30;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_80._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2f8 = "";
  pvVar4 = local_a0;
  local_a0[0] = valid_hex_64._M_string_length._0_1_;
  local_c0._0_4_ = 0x42;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (local_80,&local_300,0x138);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x139;
  file_09.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_320,
             msg_09);
  local_98 = false;
  local_a0[0] = (string)0x30;
  local_a0._1_7_ = 0x1139f;
  local_90._M_local_buf[0] = '@';
  local_90._M_allocated_capacity._1_7_ = 0x114e1;
  local_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_328 = "";
  pcVar3 = (char *)0xffffffffffffffff;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             &valid_hex_64,2,0xffffffffffffffff);
  input_08._M_str = pcVar3;
  input_08._M_len = local_e0._0_8_;
  detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)local_e0._8_8_,input_08);
  if (local_60 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)local_c0,(base_blob<256u> *)local_80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_120,&valid_hex_64,2,0xffffffffffffffff);
    str._M_str = local_120._M_dataplus._M_p;
    str._M_len = local_120._M_string_length;
    ToLower_abi_cxx11_(&local_100,str);
    pvVar5 = (iterator)0x2;
    pvVar4 = local_c0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_a0,&local_330,0x139,1,2,pvVar4,
               "uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString()",&local_100,
               "ToLower(valid_hex_64.substr(2))");
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    local_340 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_338 = "";
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar4;
    msg_10.m_begin = pvVar5;
    file_10.m_end = (iterator)0x13a;
    file_10.m_begin = (iterator)&local_340;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_350,
               msg_10);
    local_98 = false;
    local_a0[0] = (string)0x30;
    local_a0._1_7_ = 0x1139f;
    local_90._M_local_buf[0] = '@';
    local_90._M_allocated_capacity._1_7_ = 0x114e1;
    local_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_360 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_358 = "";
    pcVar3 = (char *)0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               &valid_hex_64,0,0xffffffffffffffff);
    input_09._M_str = pcVar3;
    input_09._M_len = local_e0._0_8_;
    detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)local_e0._8_8_,input_09);
    if (local_60 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_((string *)local_c0,(base_blob<256u> *)local_80);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_120,&valid_hex_64,2,0xffffffffffffffff);
      __return_storage_ptr__ = &local_100;
      str_00._M_str = local_120._M_dataplus._M_p;
      str_00._M_len = local_120._M_string_length;
      ToLower_abi_cxx11_(__return_storage_ptr__,str_00);
      pvVar5 = (iterator)0x2;
      pvVar4 = local_c0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_a0,&local_360,0x13a,1,2,pvVar4,
                 "uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString()",
                 __return_storage_ptr__,"ToLower(valid_hex_64.substr(2))");
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      local_370 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_368 = "";
      ppuVar2 = &local_380;
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_11.m_end = pvVar4;
      msg_11.m_begin = pvVar5;
      file_11.m_end = (iterator)0x13c;
      file_11.m_begin = (iterator)&local_370;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)ppuVar2,
                 msg_11);
      input_10._M_str = (char *)ppuVar2;
      input_10._M_len = (size_t)"0x0 ";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x4,input_10);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\"0x0 \")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_388 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_390,0x13c);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_3a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_398 = "";
      ppuVar2 = &local_3b0;
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_12.m_end = pvVar5;
      msg_12.m_begin = pvVar4;
      file_12.m_end = (iterator)0x13d;
      file_12.m_begin = (iterator)&local_3a0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)ppuVar2,
                 msg_12);
      input_11._M_str = (char *)ppuVar2;
      input_11._M_len = (size_t)" 0x0";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x4,input_11);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\" 0x0\")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_3c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3b8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_3c0,0x13d);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_3d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3c8 = "";
      ppuVar2 = &local_3e0;
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_13.m_end = pvVar5;
      msg_13.m_begin = pvVar4;
      file_13.m_end = (iterator)0x13e;
      file_13.m_begin = (iterator)&local_3d0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)ppuVar2,
                 msg_13);
      input_12._M_str = (char *)ppuVar2;
      input_12._M_len = (size_t)"0x 0";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x4,input_12);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\"0x 0\")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3e8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_3f0,0x13e);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3f8 = "";
      ppuVar2 = &local_410;
      local_410 = &boost::unit_test::basic_cstring<char_const>::null;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_14.m_end = pvVar5;
      msg_14.m_begin = pvVar4;
      file_14.m_end = (iterator)0x13f;
      file_14.m_begin = (iterator)&local_400;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)ppuVar2,
                 msg_14);
      input_13._M_str = (char *)ppuVar2;
      input_13._M_len = (size_t)" ";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)&DAT_00000001,input_13);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\" \")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_420 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_418 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_420,0x13f);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_430 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_428 = "";
      ppuVar2 = &local_440;
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_15.m_end = pvVar5;
      msg_15.m_begin = pvVar4;
      file_15.m_end = (iterator)0x140;
      file_15.m_begin = (iterator)&local_430;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)ppuVar2,
                 msg_15);
      input_14._M_str = (char *)ppuVar2;
      input_14._M_len = (size_t)"0x0ga";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x5,input_14);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\"0x0ga\")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_450 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_448 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_450,0x140);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_460 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_458 = "";
      ppuVar2 = &local_470;
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_16.m_end = pvVar5;
      msg_16.m_begin = pvVar4;
      file_16.m_end = (iterator)0x141;
      file_16.m_begin = (iterator)&local_460;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)ppuVar2,
                 msg_16);
      input_15._M_str = (char *)ppuVar2;
      input_15._M_len = (size_t)"x0";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x2,input_15);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\"x0\")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_480 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_478 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_480,0x141);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_490 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_488 = "";
      ppuVar2 = &local_4a0;
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_498 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_17.m_end = pvVar5;
      msg_17.m_begin = pvVar4;
      file_17.m_end = (iterator)0x142;
      file_17.m_begin = (iterator)&local_490;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)ppuVar2,
                 msg_17);
      input_16._M_str = (char *)ppuVar2;
      input_16._M_len = (size_t)"0x0x00";
      detail::FromUserHex<uint256>((optional<uint256> *)local_80,(detail *)0x6,input_16);
      local_c0._0_8_ = CONCAT71(local_c0._1_7_,local_60) ^ 1;
      local_c0._8_8_ = (element_type *)0x0;
      aStack_b0._M_allocated_capacity = 0;
      local_e0._0_8_ = "!uint256::FromUserHex(\"0x0x00\")";
      local_e0._8_8_ = "";
      local_98 = false;
      local_a0[0] = (string)0x70;
      local_a0._1_7_ = 0x113a0;
      local_90._M_local_buf[0] = '@';
      local_90._M_allocated_capacity._1_7_ = 0x114e1;
      local_4b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4a8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_90._8_8_ = (string *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_c0,(lazy_ostream *)local_a0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_4b0,0x142);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
      local_4c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_18.m_end = pvVar5;
      msg_18.m_begin = pvVar4;
      file_18.m_end = (iterator)0x143;
      file_18.m_begin = (iterator)&local_4c0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4d0,
                 msg_18);
      pcVar3 = (char *)0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &valid_hex_64,2,0xffffffffffffffff);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     "0");
      input_17._M_len._1_7_ = local_a0._1_7_;
      input_17._M_len._0_1_ = local_a0[0];
      input_17._M_str = pcVar3;
      detail::FromUserHex<uint256>
                ((optional<uint256> *)local_80,(detail *)CONCAT71(uStack_97,local_98),input_17);
      local_100._M_dataplus._M_p =
           (pointer)(CONCAT71(local_100._M_dataplus._M_p._1_7_,local_60) ^ 1);
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity = 0;
      local_120._M_dataplus._M_p = "!uint256::FromUserHex(valid_hex_64.substr(2) + \"0\")";
      local_120._M_string_length = 0xc67f5c;
      local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
      local_e0._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_4e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4d8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      aStack_d0._8_8_ = &local_120;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_4e0,0x143);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_100.field_2._M_allocated_capacity);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_c0);
      local_4f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4e8 = "";
      ppuVar2 = &local_500;
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_19.m_end = pvVar5;
      msg_19.m_begin = pvVar4;
      file_19.m_end = (iterator)0x144;
      file_19.m_begin = (iterator)&local_4f0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)ppuVar2,
                 msg_19);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &valid_hex_64,"a");
      input_18._M_len._1_7_ = local_a0._1_7_;
      input_18._M_len._0_1_ = local_a0[0];
      input_18._M_str = (char *)ppuVar2;
      detail::FromUserHex<uint256>
                ((optional<uint256> *)local_80,(detail *)CONCAT71(uStack_97,local_98),input_18);
      local_e0._0_8_ = CONCAT71(local_e0._1_7_,local_60) ^ 1;
      local_e0._8_8_ = (element_type *)0x0;
      aStack_d0._M_allocated_capacity = 0;
      local_100._M_dataplus._M_p = "!uint256::FromUserHex(valid_hex_64 + \"a\")";
      local_100._M_string_length = 0xc67f86;
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_510 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_508 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      aStack_b0._8_8_ = &local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_c0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_510,0x144);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_d0._M_allocated_capacity);
      std::__cxx11::string::~string((string *)local_a0);
      local_520 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_518 = "";
      ppuVar2 = &local_530;
      local_530 = &boost::unit_test::basic_cstring<char_const>::null;
      local_528 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_20.m_end = pvVar5;
      msg_20.m_begin = pvVar4;
      file_20.m_end = (iterator)0x145;
      file_20.m_begin = (iterator)&local_520;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)ppuVar2,
                 msg_20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &valid_hex_64," ");
      input_19._M_len._1_7_ = local_a0._1_7_;
      input_19._M_len._0_1_ = local_a0[0];
      input_19._M_str = (char *)ppuVar2;
      detail::FromUserHex<uint256>
                ((optional<uint256> *)local_80,(detail *)CONCAT71(uStack_97,local_98),input_19);
      local_e0._0_8_ = CONCAT71(local_e0._1_7_,local_60) ^ 1;
      local_e0._8_8_ = (element_type *)0x0;
      aStack_d0._M_allocated_capacity = 0;
      local_100._M_dataplus._M_p = "!uint256::FromUserHex(valid_hex_64 + \" \")";
      local_100._M_string_length = 0xc67fb0;
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_540 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_538 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      aStack_b0._8_8_ = &local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_c0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_540,0x145);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_d0._M_allocated_capacity);
      std::__cxx11::string::~string((string *)local_a0);
      local_550 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_548 = "";
      ppuVar2 = &local_560;
      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
      local_558 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_21.m_end = pvVar5;
      msg_21.m_begin = pvVar4;
      file_21.m_end = (iterator)0x146;
      file_21.m_begin = (iterator)&local_550;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)ppuVar2,
                 msg_21);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &valid_hex_64,"z");
      input_20._M_len._1_7_ = local_a0._1_7_;
      input_20._M_len._0_1_ = local_a0[0];
      input_20._M_str = (char *)ppuVar2;
      detail::FromUserHex<uint256>
                ((optional<uint256> *)local_80,(detail *)CONCAT71(uStack_97,local_98),input_20);
      local_e0._0_8_ = CONCAT71(local_e0._1_7_,local_60) ^ 1;
      local_e0._8_8_ = (element_type *)0x0;
      aStack_d0._M_allocated_capacity = 0;
      local_100._M_dataplus._M_p = "!uint256::FromUserHex(valid_hex_64 + \"z\")";
      local_100._M_string_length = 0xc67fda;
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_570 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_568 = "";
      aStack_b0._8_8_ = &local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_c0,1,0,WARN,
                 (check_type)__return_storage_ptr__,(size_t)&local_570,0x146);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_d0._M_allocated_capacity);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)&valid_hex_64);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(from_user_hex)
{
    BOOST_CHECK_EQUAL(uint256::FromUserHex(""), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("00"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("1"), uint256::ONE);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0xFf"), uint256{0xff});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("Ff"), uint256{0xff});
    const std::string valid_hex_64{"0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF"};
    BOOST_REQUIRE_EQUAL(valid_hex_64.size(), 2 + 64); // 0x prefix and 64 hex digits
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString(), ToLower(valid_hex_64.substr(2)));
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString(), ToLower(valid_hex_64.substr(2)));

    BOOST_CHECK(!uint256::FromUserHex("0x0 "));                       // no spaces at end,
    BOOST_CHECK(!uint256::FromUserHex(" 0x0"));                       // or beginning,
    BOOST_CHECK(!uint256::FromUserHex("0x 0"));                       // or middle,
    BOOST_CHECK(!uint256::FromUserHex(" "));                          // etc.
    BOOST_CHECK(!uint256::FromUserHex("0x0ga"));                      // invalid character
    BOOST_CHECK(!uint256::FromUserHex("x0"));                         // broken prefix
    BOOST_CHECK(!uint256::FromUserHex("0x0x00"));                     // two prefixes not allowed
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64.substr(2) + "0")); // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "a"));           // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + " "));           // whitespace after max length
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "z"));           // invalid character after max length
}